

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O3

FILE * fl_fopen(char *f,char *mode)

{
  FILE *pFVar1;
  
  pFVar1 = fopen64(f,mode);
  return (FILE *)pFVar1;
}

Assistant:

FILE *fl_fopen(const char* f, const char *mode) {

#if  defined (WIN32) && !defined(__CYGWIN__)

  size_t l = strlen(f);
  unsigned wn = fl_utf8toUtf16(f, (unsigned) l, NULL, 0) + 1; // Query length
  wbuf = (xchar*)realloc(wbuf, sizeof(xchar)*wn);
  wn = fl_utf8toUtf16(f, (unsigned) l, (unsigned short *)wbuf, wn); // Convert string
  wbuf[wn] = 0;
  l = strlen(mode);
  wn = fl_utf8toUtf16(mode, (unsigned) l, NULL, 0) + 1; // Query length
  wbuf1 = (xchar*)realloc(wbuf1, sizeof(xchar)*wn);
  wn = fl_utf8toUtf16(mode, (unsigned) l, (unsigned short *)wbuf1, wn); // Convert string
  wbuf1[wn] = 0;
  return _wfopen(wbuf, wbuf1);

#else

  return fopen(f, mode);

#endif

}